

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

void __thiscall
embree::OBJMaterial::OBJMaterial
          (OBJMaterial *this,float d,Vec3fa *Kd,Vec3fa *Ks,float Ns,string *name)

{
  size_type sVar1;
  size_t sVar2;
  undefined8 *in_RDX;
  size_type *in_RSI;
  MaterialNode *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  string *in_stack_ffffffffffffff08;
  allocator local_c9;
  string local_c8 [44];
  undefined4 local_9c;
  undefined8 *local_98;
  size_type *local_90;
  undefined4 local_84;
  size_type *local_78;
  size_type *local_70;
  undefined8 *local_68;
  undefined8 *local_60;
  undefined4 local_54;
  undefined8 *local_50;
  undefined4 local_44;
  bool *local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  undefined4 uStack_8;
  
  local_9c = in_XMM1_Da;
  local_98 = in_RDX;
  local_90 = in_RSI;
  local_84 = in_XMM0_Da;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"",&local_c9);
  SceneGraph::MaterialNode::MaterialNode(in_RDI,in_stack_ffffffffffffff08);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  (in_RDI->super_Node).super_RefCount._vptr_RefCount = (_func_int **)&PTR__OBJMaterial_006475e0;
  Material::Material((Material *)&in_RDI[1].super_Node.super_RefCount.refCounter,MATERIAL_OBJ);
  *(undefined4 *)&in_RDI[1].super_Node.fileName._M_string_length = 0;
  *(undefined4 *)((long)&in_RDI[1].super_Node.fileName._M_string_length + 4) = local_84;
  *(undefined4 *)&in_RDI[1].super_Node.fileName.field_2 = local_9c;
  *(undefined4 *)((long)&in_RDI[1].super_Node.fileName.field_2 + 4) = 0x3f800000;
  local_50 = (undefined8 *)((long)&in_RDI[1].super_Node.fileName.field_2 + 8);
  local_54 = 0;
  uStack_8 = 0;
  local_18 = 0;
  uStack_14 = 0;
  uStack_10 = 0;
  uStack_c = 0;
  *local_50 = 0;
  *(undefined8 *)&in_RDI[1].super_Node.name = 0;
  local_70 = &in_RDI[1].super_Node.name._M_string_length;
  local_78 = local_90;
  sVar1 = local_90[1];
  *local_70 = *local_90;
  in_RDI[1].super_Node.name.field_2._M_allocated_capacity = sVar1;
  local_60 = (undefined8 *)((long)&in_RDI[1].super_Node.name.field_2 + 8);
  local_68 = local_98;
  sVar2 = local_98[1];
  *local_60 = *local_98;
  in_RDI[1].super_Node.indegree = sVar2;
  local_40 = &in_RDI[1].super_Node.closed;
  local_44 = 0x3f800000;
  local_28 = 0x3f800000;
  local_38 = 0x3f800000;
  uStack_34 = 0x3f800000;
  uStack_30 = 0x3f800000;
  uStack_2c = 0x3f800000;
  in_RDI[1].super_Node.closed = false;
  in_RDI[1].super_Node.hasLightOrCamera = false;
  *(undefined2 *)&in_RDI[1].super_Node.field_0x5a = 0x3f80;
  in_RDI[1].super_Node.id = 0x3f800000;
  in_RDI[1].super_Node.geometry = (void *)0x3f8000003f800000;
  in_RDI[2].super_Node.super_RefCount._vptr_RefCount = (_func_int **)0x0;
  in_RDI[2].super_Node.super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)&in_RDI[2].super_Node.fileName = 0;
  in_RDI[2].super_Node.fileName._M_string_length = 0;
  in_RDI[2].super_Node.fileName.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&in_RDI[2].super_Node.fileName.field_2 + 8) = 0;
  *(undefined8 *)&in_RDI[2].super_Node.name = 0;
  std::shared_ptr<embree::Texture>::shared_ptr((shared_ptr<embree::Texture> *)0x41add3);
  std::shared_ptr<embree::Texture>::shared_ptr((shared_ptr<embree::Texture> *)0x41ade4);
  std::shared_ptr<embree::Texture>::shared_ptr((shared_ptr<embree::Texture> *)0x41adf5);
  std::shared_ptr<embree::Texture>::shared_ptr((shared_ptr<embree::Texture> *)0x41ae06);
  std::shared_ptr<embree::Texture>::shared_ptr((shared_ptr<embree::Texture> *)0x41ae17);
  std::shared_ptr<embree::Texture>::shared_ptr((shared_ptr<embree::Texture> *)0x41ae28);
  std::shared_ptr<embree::Texture>::shared_ptr((shared_ptr<embree::Texture> *)0x41ae39);
  return;
}

Assistant:

OBJMaterial (float d, const Vec3fa& Kd, const Vec3fa& Ks, const float Ns, const std::string name = "")
      : base(MATERIAL_OBJ), illum(0), d(d), Ns(Ns), Ni(1.f), Ka(0.f), Kd(Kd), Ks(Ks), Kt(1.0f),
        map_d(nullptr), map_Ka(nullptr), map_Kd(nullptr), map_Ks(nullptr), map_Kt(nullptr), map_Ns(nullptr), map_Displ(nullptr) {}